

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::cleanup::ChunkList::AddFallback
          (ChunkList *this,void *elem,_func_void_void_ptr *destructor,SerialArena *arena)

{
  CleanupNode **v1;
  CleanupNode **v2;
  LogMessage *pLVar1;
  AllocationPolicy *policy_ptr;
  CleanupNode *pCVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  SizedPtr SVar5;
  size_t local_d0;
  Chunk *local_a0;
  SizedPtr mem;
  LogMessageFatal local_70 [23];
  Voidify local_59;
  string *local_58;
  string *absl_log_internal_check_op_result;
  SerialArena *arena_local;
  _func_void_void_ptr *destructor_local;
  void *elem_local;
  ChunkList *this_local;
  
  absl_log_internal_check_op_result = (string *)arena;
  arena_local = (SerialArena *)destructor;
  destructor_local = (_func_void_void_ptr *)elem;
  elem_local = this;
  v1 = absl::lts_20240722::log_internal::
       GetReferenceableValue<google::protobuf::internal::cleanup::CleanupNode*>(&this->next_);
  v2 = absl::lts_20240722::log_internal::
       GetReferenceableValue<google::protobuf::internal::cleanup::CleanupNode*>(&this->limit_);
  local_58 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::cleanup::CleanupNode*,google::protobuf::internal::cleanup::CleanupNode*>
                       (v1,v2,"next_ == limit_");
  if (local_58 != (string *)0x0) {
    auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/arena.cc"
               ,0x89,auVar4._0_8_,auVar4._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_70);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_59,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_70);
  }
  policy_ptr = ThreadSafeArena::AllocPolicy
                         (*(ThreadSafeArena **)(absl_log_internal_check_op_result + 3));
  if (this->head_ == (Chunk *)0x0) {
    local_d0 = 0;
  }
  else {
    local_d0 = this->head_->size;
  }
  SVar5 = anon_unknown_12::AllocateCleanupChunk(policy_ptr,local_d0);
  mem.p = (void *)SVar5.n;
  SerialArena::AddSpaceAllocated((SerialArena *)absl_log_internal_check_op_result,(size_t)mem.p);
  local_a0 = (Chunk *)SVar5.p;
  local_a0->next = this->head_;
  local_a0->size = (size_t)mem.p;
  this->head_ = local_a0;
  pCVar2 = Chunk::First(this->head_);
  this->next_ = pCVar2;
  this->prefetch_ptr_ = (char *)this->next_;
  pCVar2 = this->next_;
  sVar3 = Chunk::Capacity((size_t)mem.p);
  this->limit_ = pCVar2 + sVar3;
  pCVar2 = this->next_;
  this->next_ = pCVar2 + 1;
  pCVar2->elem = destructor_local;
  pCVar2->destructor = (_func_void_void_ptr *)arena_local;
  return;
}

Assistant:

void ChunkList::AddFallback(void* elem, void (*destructor)(void*),
                            SerialArena& arena) {
  ABSL_DCHECK_EQ(next_, limit_);
  SizedPtr mem = AllocateCleanupChunk(arena.parent_.AllocPolicy(),
                                      head_ == nullptr ? 0 : head_->size);
  arena.AddSpaceAllocated(mem.n);
  head_ = new (mem.p) Chunk{head_, mem.n};
  next_ = head_->First();
  prefetch_ptr_ = reinterpret_cast<char*>(next_);
  limit_ = next_ + Chunk::Capacity(mem.n);
  AddFromExisting(elem, destructor);
}